

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_surface_mesh.cpp
# Opt level: O1

Vertex __thiscall
geometrycentral::surface::ManifoldSurfaceMesh::insertVertex(ManifoldSurfaceMesh *this,Face fIn)

{
  size_type sVar1;
  uint64_t *puVar2;
  unsigned_long uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  unsigned_long uVar8;
  long lVar9;
  unsigned_long uVar10;
  ParentMeshT *pPVar11;
  ParentMeshT *pPVar12;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_type sVar17;
  size_type __n;
  size_type sVar19;
  ParentMeshT *pPVar20;
  size_t sVar21;
  Vertex VVar22;
  Halfedge HVar23;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> innerFaces
  ;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  faceBoundaryHalfedges;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  trailingHalfedges;
  Halfedge he;
  vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> innerEdges
  ;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  leadingHalfedges;
  vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_> local_f8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_d8;
  Halfedge *local_c8;
  Face local_b8;
  ManifoldSurfaceMesh *local_a8;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_a0;
  ParentMeshT *local_88;
  pointer local_80;
  pointer local_78;
  Halfedge local_70;
  vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_> local_60;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  local_48;
  size_type sVar18;
  
  local_b8.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
       = fIn.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         ind;
  local_b8.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
       = fIn.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         mesh;
  VVar22 = SurfaceMesh::getNewVertex(&this->super_SurfaceMesh);
  local_88 = VVar22.
             super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
             mesh;
  uVar3 = ((local_b8.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [local_b8.
           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind]
  ;
  uVar13 = uVar3;
  __n = 0;
  do {
    sVar18 = __n;
    __n = sVar18 + 1;
    uVar13 = ((local_b8.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
              mesh)->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13];
  } while (uVar13 != uVar3);
  local_f8.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Face *)0x0;
  local_f8.
  super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Face *)0x0;
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector(&local_48,__n,(allocator_type *)&local_a0);
  ::std::
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>::
  vector(&local_a0,__n,(allocator_type *)&local_60);
  ::std::vector<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>::
  vector(&local_60,__n,(allocator_type *)&local_d8);
  if (__n != 0) {
    lVar15 = 8;
    sVar19 = 0;
    do {
      if (sVar19 == 0) {
        pPVar20 = local_b8.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        sVar21 = local_b8.
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .ind;
        if (local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00169418;
        ::std::vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
        ::_M_realloc_insert<geometrycentral::surface::Face_const&>
                  ((vector<geometrycentral::surface::Face,std::allocator<geometrycentral::surface::Face>>
                    *)&local_f8,
                   (iterator)
                   local_f8.
                   super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
      }
      else {
        local_d8 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
                   SurfaceMesh::getNewFace(&this->super_SurfaceMesh);
        if (local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>::
          _M_realloc_insert<geometrycentral::surface::Face>
                    (&local_f8,
                     (iterator)
                     local_f8.
                     super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Face *)&local_d8);
        }
        else {
          pPVar20 = local_d8.mesh;
          sVar21 = local_d8.ind;
LAB_00169418:
          ((local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).mesh
               = pPVar20;
          ((local_f8.
            super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
            ._M_impl.super__Vector_impl_data._M_finish)->
          super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>).ind
               = sVar21;
          local_f8.
          super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_f8.
               super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      HVar23 = SurfaceMesh::getNewEdgeTriple(&this->super_SurfaceMesh,false);
      uVar14 = HVar23.
               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .ind;
      pPVar12 = HVar23.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      *(ParentMeshT **)
       ((long)local_48.
              super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) = pPVar12;
      *(ulong *)((long)&((local_48.
                          super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        ).mesh + lVar15) = uVar14;
      if (pPVar12->useImplicitTwinFlag == true) {
        uVar16 = uVar14 ^ 1;
      }
      else {
        uVar16 = (pPVar12->heSiblingArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
      }
      sVar1 = sVar19 + 1;
      sVar17 = 0;
      if (sVar18 != sVar19) {
        sVar17 = sVar1;
      }
      local_a0.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar17].
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = pPVar12;
      local_a0.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar17].
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           uVar16;
      if (pPVar12->useImplicitTwinFlag == true) {
        uVar14 = uVar14 >> 1;
      }
      else {
        uVar14 = (pPVar12->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar14];
      }
      *(ParentMeshT **)
       ((long)local_60.
              super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) = pPVar12;
      *(ulong *)((long)&((local_60.
                          super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                        ).mesh + lVar15) = uVar14;
      lVar15 = lVar15 + 0x10;
      sVar19 = sVar1;
    } while (__n != sVar1);
  }
  pPVar20 = local_b8.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  local_d8 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
             ZEXT816(0);
  local_c8 = (Halfedge *)0x0;
  uVar3 = ((local_b8.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
           mesh)->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [local_b8.
           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind]
  ;
  uVar13 = uVar3;
  local_a8 = this;
  do {
    local_70.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar20;
    local_70.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar13;
    if ((Halfedge *)local_d8.ind == local_c8) {
      ::std::
      vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
      ::_M_realloc_insert<geometrycentral::surface::Halfedge_const&>
                ((vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
                  *)&local_d8,(iterator)local_d8.ind,&local_70);
    }
    else {
      ((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> *)
      local_d8.ind)->mesh = pPVar20;
      ((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> *)
      local_d8.ind)->ind = uVar13;
      local_d8.ind = (size_t)(local_d8.ind + 0x10);
    }
    uVar13 = (pPVar20->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13];
  } while (uVar13 != uVar3);
  if (__n != 0) {
    local_78 = local_f8.
               super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_80 = local_48.
               super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
               ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (local_a8->super_SurfaceMesh).fHalfedgeArr.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (local_a8->super_SurfaceMesh).heNextArr.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (local_a8->super_SurfaceMesh).heVertexArr.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (local_a8->super_SurfaceMesh).heFaceArr.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = 8;
    do {
      uVar3 = *(unsigned_long *)
               ((long)&((local_f8.
                         super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                       ).mesh + lVar15);
      uVar13 = *(unsigned_long *)
                ((long)&((local_48.
                          super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        ).mesh + lVar15);
      uVar8 = *(unsigned_long *)
               ((long)&((local_a0.
                         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       ).mesh + lVar15);
      lVar9 = *(long *)((long)local_d8.mesh + lVar15 + -8);
      uVar10 = *(unsigned_long *)((long)&(local_d8.mesh)->_vptr_SurfaceMesh + lVar15);
      puVar4[uVar3] = uVar10;
      puVar5[uVar13] = uVar8;
      puVar6[uVar13] =
           *(unsigned_long *)
            (*(long *)(lVar9 + 0x128) + *(long *)(*(long *)(lVar9 + 0x110) + uVar10 * 8) * 8);
      puVar7[uVar13] = uVar3;
      puVar5[uVar8] = uVar10;
      puVar6[uVar8] =
           VVar22.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind;
      puVar7[uVar8] = uVar3;
      puVar5[uVar10] = uVar13;
      puVar7[uVar10] = uVar3;
      lVar15 = lVar15 + 0x10;
      __n = __n - 1;
    } while (__n != 0);
  }
  (local_a8->super_SurfaceMesh).vHalfedgeArr.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start[VVar22.
           super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
           ind] =
       ((local_a0.
         super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>).ind
  ;
  puVar2 = &(local_a8->super_SurfaceMesh).modificationTick;
  *puVar2 = *puVar2 + 1;
  if (local_d8.mesh != (ParentMeshT *)0x0) {
    operator_delete(local_d8.mesh);
  }
  pPVar11 = local_88;
  if (local_60.
      super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<geometrycentral::surface::Edge,_std::allocator<geometrycentral::surface::Edge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.
      super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<geometrycentral::surface::Face,_std::allocator<geometrycentral::surface::Face>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  VVar22.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
       = pPVar11;
  return (Vertex)VVar22.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
  ;
}

Assistant:

Vertex ManifoldSurfaceMesh::insertVertex(Face fIn) {

  // Create the new center vertex
  Vertex centerVert = getNewVertex();

  // Count degree to allocate elements
  size_t faceDegree = fIn.degree();

  // == Create new halfedges/edges/faces around the center vertex

  // Create all of the new elements first, then hook them up below
  std::vector<Face> innerFaces;
  std::vector<Halfedge> leadingHalfedges(faceDegree); // the one that points towards the center
  std::vector<Halfedge> trailingHalfedges(faceDegree);
  std::vector<Edge> innerEdges(faceDegree); // aligned with leading he
  for (size_t i = 0; i < faceDegree; i++) {
    // Re-use first face
    if (i == 0) {
      innerFaces.push_back(fIn);
    } else {
      innerFaces.push_back(getNewFace());
    }

    // Get the new edge group
    Halfedge newHe = getNewEdgeTriple(false);

    leadingHalfedges[i] = newHe;
    trailingHalfedges[(i + 1) % faceDegree] = newHe.twin();
    innerEdges[i] = newHe.edge();
  }

  // Form this list before we start, because we're about to start breaking pointers
  std::vector<Halfedge> faceBoundaryHalfedges;
  for (Halfedge he : fIn.adjacentHalfedges()) {
    faceBoundaryHalfedges.push_back(he);
  }

  // Connect up all the pointers
  // Each iteration processes one inner face
  for (size_t i = 0; i < faceDegree; i++) {

    // Gather pointers
    Face f = innerFaces[i];
    Edge e = innerEdges[i];
    Edge prevE = innerEdges[(i + faceDegree - 1) % faceDegree];
    Halfedge leadingHe = leadingHalfedges[i];
    Halfedge trailingHe = trailingHalfedges[i];
    Halfedge boundaryHe = faceBoundaryHalfedges[i];
    Halfedge nextTrailingHe = trailingHalfedges[(i + 1) % faceDegree];
    Halfedge prevLeadingHe = leadingHalfedges[(i + faceDegree - 1) % faceDegree];

    // face
    fHalfedgeArr[f.getIndex()] = boundaryHe.getIndex();

    // leading halfedge
    heNextArr[leadingHe.getIndex()] = trailingHe.getIndex();
    heVertexArr[leadingHe.getIndex()] = boundaryHe.next().vertex().getIndex();
    heFaceArr[leadingHe.getIndex()] = f.getIndex();

    // trailing halfedge
    heNextArr[trailingHe.getIndex()] = boundaryHe.getIndex();
    heVertexArr[trailingHe.getIndex()] = centerVert.getIndex();
    heFaceArr[trailingHe.getIndex()] = f.getIndex();

    // boundary halfedge
    heNextArr[boundaryHe.getIndex()] = leadingHe.getIndex();
    heFaceArr[boundaryHe.getIndex()] = f.getIndex();
  }

  vHalfedgeArr[centerVert.getIndex()] = trailingHalfedges[0].getIndex();

  modificationTick++;
  return centerVert;
}